

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilTruth.c
# Opt level: O0

void Extra_TruthCountOnesInCofs(uint *pTruth,int nVars,short *pStore)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint local_2c;
  int Counter;
  int k;
  int i;
  int nWords;
  short *pStore_local;
  uint *puStack_10;
  int nVars_local;
  uint *pTruth_local;
  
  iVar1 = Extra_TruthWordNum(nVars);
  memset(pStore,0,(long)nVars << 2);
  if (nVars < 6) {
    if (0 < nVars) {
      iVar1 = Extra_WordCountOnes(*pTruth & 0x55555555);
      *pStore = (short)iVar1;
      iVar1 = Extra_WordCountOnes(*pTruth & 0xaaaaaaaa);
      pStore[1] = (short)iVar1;
    }
    if (1 < nVars) {
      iVar1 = Extra_WordCountOnes(*pTruth & 0x33333333);
      pStore[2] = (short)iVar1;
      iVar1 = Extra_WordCountOnes(*pTruth & 0xcccccccc);
      pStore[3] = (short)iVar1;
    }
    if (2 < nVars) {
      iVar1 = Extra_WordCountOnes(*pTruth & 0xf0f0f0f);
      pStore[4] = (short)iVar1;
      iVar1 = Extra_WordCountOnes(*pTruth & 0xf0f0f0f0);
      pStore[5] = (short)iVar1;
    }
    if (3 < nVars) {
      iVar1 = Extra_WordCountOnes(*pTruth & 0xff00ff);
      pStore[6] = (short)iVar1;
      iVar1 = Extra_WordCountOnes(*pTruth & 0xff00ff00);
      pStore[7] = (short)iVar1;
    }
    if (4 < nVars) {
      iVar1 = Extra_WordCountOnes(*pTruth & 0xffff);
      pStore[8] = (short)iVar1;
      iVar1 = Extra_WordCountOnes(*pTruth & 0xffff0000);
      pStore[9] = (short)iVar1;
    }
  }
  else {
    for (local_2c = 0; (int)local_2c < iVar1; local_2c = local_2c + 1) {
      iVar2 = Extra_WordCountOnes(pTruth[(int)local_2c]);
      for (Counter = 5; Counter < nVars; Counter = Counter + 1) {
        if ((local_2c & 1 << ((char)Counter - 5U & 0x1f)) == 0) {
          pStore[Counter << 1] = pStore[Counter << 1] + (short)iVar2;
        }
        else {
          iVar3 = Counter * 2 + 1;
          pStore[iVar3] = pStore[iVar3] + (short)iVar2;
        }
      }
    }
    puStack_10 = pTruth;
    for (local_2c = 0; (int)local_2c < iVar1 / 2; local_2c = local_2c + 1) {
      iVar2 = Extra_WordCountOnes(*puStack_10 & 0x55555555 | (puStack_10[1] & 0x55555555) << 1);
      *pStore = *pStore + (short)iVar2;
      iVar2 = Extra_WordCountOnes(*puStack_10 & 0xaaaaaaaa | (puStack_10[1] & 0xaaaaaaaa) >> 1);
      pStore[1] = pStore[1] + (short)iVar2;
      iVar2 = Extra_WordCountOnes(*puStack_10 & 0x33333333 | (puStack_10[1] & 0x33333333) << 2);
      pStore[2] = pStore[2] + (short)iVar2;
      iVar2 = Extra_WordCountOnes(*puStack_10 & 0xcccccccc | (puStack_10[1] & 0xcccccccc) >> 2);
      pStore[3] = pStore[3] + (short)iVar2;
      iVar2 = Extra_WordCountOnes(*puStack_10 & 0xf0f0f0f | (puStack_10[1] & 0xf0f0f0f) << 4);
      pStore[4] = pStore[4] + (short)iVar2;
      iVar2 = Extra_WordCountOnes(*puStack_10 & 0xf0f0f0f0 | (puStack_10[1] & 0xf0f0f0f0) >> 4);
      pStore[5] = pStore[5] + (short)iVar2;
      iVar2 = Extra_WordCountOnes(*puStack_10 & 0xff00ff | (puStack_10[1] & 0xff00ff) << 8);
      pStore[6] = pStore[6] + (short)iVar2;
      iVar2 = Extra_WordCountOnes(*puStack_10 & 0xff00ff00 | (puStack_10[1] & 0xff00ff00) >> 8);
      pStore[7] = pStore[7] + (short)iVar2;
      iVar2 = Extra_WordCountOnes(*puStack_10 & 0xffff | puStack_10[1] << 0x10);
      pStore[8] = pStore[8] + (short)iVar2;
      iVar2 = Extra_WordCountOnes(*puStack_10 & 0xffff0000 | puStack_10[1] >> 0x10);
      pStore[9] = pStore[9] + (short)iVar2;
      puStack_10 = puStack_10 + 2;
    }
  }
  return;
}

Assistant:

void Extra_TruthCountOnesInCofs( unsigned * pTruth, int nVars, short * pStore )
{
    int nWords = Extra_TruthWordNum( nVars );
    int i, k, Counter;
    memset( pStore, 0, sizeof(short) * 2 * nVars );
    if ( nVars <= 5 )
    {
        if ( nVars > 0 )
        {
            pStore[2*0+0] = Extra_WordCountOnes( pTruth[0] & 0x55555555 );
            pStore[2*0+1] = Extra_WordCountOnes( pTruth[0] & 0xAAAAAAAA );
        }
        if ( nVars > 1 )
        {
            pStore[2*1+0] = Extra_WordCountOnes( pTruth[0] & 0x33333333 );
            pStore[2*1+1] = Extra_WordCountOnes( pTruth[0] & 0xCCCCCCCC );
        }
        if ( nVars > 2 )
        {
            pStore[2*2+0] = Extra_WordCountOnes( pTruth[0] & 0x0F0F0F0F );
            pStore[2*2+1] = Extra_WordCountOnes( pTruth[0] & 0xF0F0F0F0 );
        }
        if ( nVars > 3 )
        {
            pStore[2*3+0] = Extra_WordCountOnes( pTruth[0] & 0x00FF00FF );
            pStore[2*3+1] = Extra_WordCountOnes( pTruth[0] & 0xFF00FF00 );
        }
        if ( nVars > 4 )
        {
            pStore[2*4+0] = Extra_WordCountOnes( pTruth[0] & 0x0000FFFF );
            pStore[2*4+1] = Extra_WordCountOnes( pTruth[0] & 0xFFFF0000 );
        }
        return;
    }
    // nVars >= 6
    // count 1's for all other variables
    for ( k = 0; k < nWords; k++ )
    {
        Counter = Extra_WordCountOnes( pTruth[k] );
        for ( i = 5; i < nVars; i++ )
            if ( k & (1 << (i-5)) )
                pStore[2*i+1] += Counter;
            else
                pStore[2*i+0] += Counter;
    }
    // count 1's for the first five variables
    for ( k = 0; k < nWords/2; k++ )
    {
        pStore[2*0+0] += Extra_WordCountOnes( (pTruth[0] & 0x55555555) | ((pTruth[1] & 0x55555555) <<  1) );
        pStore[2*0+1] += Extra_WordCountOnes( (pTruth[0] & 0xAAAAAAAA) | ((pTruth[1] & 0xAAAAAAAA) >>  1) );
        pStore[2*1+0] += Extra_WordCountOnes( (pTruth[0] & 0x33333333) | ((pTruth[1] & 0x33333333) <<  2) );
        pStore[2*1+1] += Extra_WordCountOnes( (pTruth[0] & 0xCCCCCCCC) | ((pTruth[1] & 0xCCCCCCCC) >>  2) );
        pStore[2*2+0] += Extra_WordCountOnes( (pTruth[0] & 0x0F0F0F0F) | ((pTruth[1] & 0x0F0F0F0F) <<  4) );
        pStore[2*2+1] += Extra_WordCountOnes( (pTruth[0] & 0xF0F0F0F0) | ((pTruth[1] & 0xF0F0F0F0) >>  4) );
        pStore[2*3+0] += Extra_WordCountOnes( (pTruth[0] & 0x00FF00FF) | ((pTruth[1] & 0x00FF00FF) <<  8) );
        pStore[2*3+1] += Extra_WordCountOnes( (pTruth[0] & 0xFF00FF00) | ((pTruth[1] & 0xFF00FF00) >>  8) );
        pStore[2*4+0] += Extra_WordCountOnes( (pTruth[0] & 0x0000FFFF) | ((pTruth[1] & 0x0000FFFF) << 16) );
        pStore[2*4+1] += Extra_WordCountOnes( (pTruth[0] & 0xFFFF0000) | ((pTruth[1] & 0xFFFF0000) >> 16) );
        pTruth += 2;
    }
}